

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O2

unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> parse(string *module)

{
  pointer pcVar1;
  Module *pMVar2;
  Element *pEVar3;
  undefined8 *in_RSI;
  SExpressionWasmBuilder local_2d8 [8];
  SExpressionWasmBuilder builder;
  SExpressionParser local_78 [8];
  SExpressionParser parser;
  MixedArena local_58;
  uint local_28;
  
  std::make_unique<wasm::Module>();
  pcVar1 = (module->_M_dataplus)._M_p;
  pcVar1[0x108] = -1;
  pcVar1[0x109] = -0x11;
  pcVar1[0x10a] = '\x01';
  pcVar1[0x10b] = '\0';
  wasm::SExpressionParser::SExpressionParser(local_78,(char *)*in_RSI);
  pMVar2 = (Module *)(module->_M_dataplus)._M_p;
  pEVar3 = (Element *)wasm::Element::operator[](local_28);
  wasm::SExpressionWasmBuilder::SExpressionWasmBuilder(local_2d8,pMVar2,pEVar3,Normal);
  wasm::SExpressionWasmBuilder::~SExpressionWasmBuilder(local_2d8);
  MixedArena::~MixedArena(&local_58);
  return (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
         (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)module;
}

Assistant:

static std::unique_ptr<Module> parse(std::string module) {
  auto wasm = std::make_unique<Module>();
  wasm->features = FeatureSet::All;
  try {
    SExpressionParser parser(&module.front());
    Element& root = *parser.root;
    SExpressionWasmBuilder builder(*wasm, *root[0], IRProfile::Normal);
  } catch (ParseException& p) {
    p.dump(std::cerr);
    Fatal() << "error in parsing wasm text";
  }
  return wasm;
}